

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  int iVar3;
  int64 iVar4;
  ulong uVar5;
  int *piVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32 first_byte_or_zero;
  uint uVar12;
  
  pbVar7 = input->buffer_;
  if (pbVar7 < input->buffer_end_) {
    uVar12 = (uint)*pbVar7;
    if (-1 < (char)*pbVar7) {
      input->buffer_ = pbVar7 + 1;
      goto LAB_0017cdd2;
    }
  }
  else {
    uVar12 = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
  uVar12 = (uint)iVar4;
  if (iVar4 < 0) {
    return false;
  }
LAB_0017cdd2:
  limit = io::CodedInputStream::PushLimit(input,uVar12);
  iVar3 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar3) {
    uVar12 = field_number << 3;
    do {
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0017ce27;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_0017ce27:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((long)uVar5 < 0) {
          return false;
        }
      }
      uVar10 = (uint)uVar5;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar2 = (*is_valid)(uVar10), bVar2)) {
        uVar11 = values->current_size_;
        if (uVar11 == values->total_size_) {
          RepeatedField<int>::Reserve(values,uVar11 + 1);
        }
        piVar6 = RepeatedField<int>::elements(values);
        piVar6[uVar11] = uVar10;
        values->current_size_ = uVar11 + 1;
      }
      else {
        pbVar7 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        if (uVar12 < 0x80) {
          *pbVar7 = (byte)uVar12;
          pbVar7 = pbVar7 + 1;
        }
        else {
          *pbVar7 = (byte)uVar12 | 0x80;
          if (uVar12 < 0x4000) {
            pbVar7[1] = (byte)(uVar12 >> 7);
            pbVar7 = pbVar7 + 2;
          }
          else {
            pbVar7 = pbVar7 + 2;
            uVar11 = uVar12 >> 7;
            do {
              pbVar8 = pbVar7;
              pbVar8[-1] = (byte)uVar11 | 0x80;
              uVar9 = uVar11 >> 7;
              pbVar7 = pbVar8 + 1;
              bVar2 = 0x3fff < uVar11;
              uVar11 = uVar9;
            } while (bVar2);
            *pbVar8 = (byte)uVar9;
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        if (uVar10 < 0x80) {
          *pbVar7 = (byte)uVar5;
          pbVar7 = pbVar7 + 1;
        }
        else {
          *pbVar7 = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7 & 0x1ffffff;
          if (uVar10 < 0x4000) {
            pbVar7[1] = (byte)uVar5;
            pbVar7 = pbVar7 + 2;
          }
          else {
            pbVar7 = pbVar7 + 2;
            do {
              pbVar8 = pbVar7;
              uVar10 = (uint)uVar5;
              pbVar8[-1] = (byte)uVar5 | 0x80;
              uVar11 = uVar10 >> 7;
              uVar5 = (ulong)uVar11;
              pbVar7 = pbVar8 + 1;
            } while (0x3fff < uVar10);
            *pbVar8 = (byte)uVar11;
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
      }
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar3);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}